

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureGatherTests.cpp
# Opt level: O1

void __thiscall
vkt::sr::anon_unknown_0::TextureGatherCubeCase::initPrograms
          (TextureGatherCubeCase *this,SourceCollections *dst)

{
  GatherType gatherType;
  OffsetSize OVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  long lVar5;
  pointer pGVar6;
  pointer pGVar7;
  size_t __n;
  vector<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
  iterations;
  vector<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
  local_68;
  vector<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
  local_48;
  
  gatherType = (this->m_baseParams).gatherType;
  __n = (size_t)gatherType;
  OVar1 = (this->m_baseParams).offsetSize;
  if (OVar1 != OFFSETSIZE_NONE) {
    if (OVar1 == OFFSETSIZE_MINIMUM_REQUIRED) {
      local_68.
      super__Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x7fffffff8;
      goto LAB_00640912;
    }
    if (OVar1 != OFFSETSIZE_IMPLEMENTATION_MAXIMUM) {
      local_68.
      super__Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0xffffffffffffffff;
      goto LAB_00640912;
    }
  }
  local_68.
  super__Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
LAB_00640912:
  generateCubeCaseIterations
            (&local_48,gatherType,&(this->m_baseParams).textureFormat,(IVec2 *)&local_68);
  local_68.
  super__Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar5 = (long)local_48.
                super__Vector_base<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_48.
                super__Vector_base<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
                ._M_impl.super__Vector_impl_data._M_start >> 3;
  if ((_Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
       *)0x38e38e38e38e38e <
      (_Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
       *)(lVar5 * -0x3333333333333333)) {
    std::__throw_length_error("cannot create std::vector larger than max_size()");
  }
  pGVar6 = std::
           _Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
           ::_M_allocate((_Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
                          *)(lVar5 * -0x3333333333333333),__n);
  local_68.
  super__Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)(lVar5 * -0x333333333333332c + (long)pGVar6);
  local_68.
  super__Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
  ._M_impl.super__Vector_impl_data._M_finish = pGVar6;
  for (pGVar7 = local_48.
                super__Vector_base<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pGVar7 != local_48.
                super__Vector_base<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
                ._M_impl.super__Vector_impl_data._M_finish; pGVar7 = pGVar7 + 1) {
    (local_68.
     super__Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
     ._M_impl.super__Vector_impl_data._M_finish)->componentNdx = (pGVar7->gatherArgs).componentNdx;
    uVar2 = *(undefined8 *)(pGVar7->gatherArgs).offsets[1].m_data;
    uVar3 = *(undefined8 *)(pGVar7->gatherArgs).offsets[2].m_data;
    uVar4 = *(undefined8 *)(pGVar7->gatherArgs).offsets[3].m_data;
    *(undefined8 *)
     (local_68.
      super__Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
      ._M_impl.super__Vector_impl_data._M_finish)->offsets[0].m_data =
         *(undefined8 *)(pGVar7->gatherArgs).offsets[0].m_data;
    *(undefined8 *)
     (local_68.
      super__Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
      ._M_impl.super__Vector_impl_data._M_finish)->offsets[1].m_data = uVar2;
    *(undefined8 *)
     (local_68.
      super__Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
      ._M_impl.super__Vector_impl_data._M_finish)->offsets[2].m_data = uVar3;
    *(undefined8 *)
     (local_68.
      super__Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
      ._M_impl.super__Vector_impl_data._M_finish)->offsets[3].m_data = uVar4;
    local_68.
    super__Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_68.
         super__Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  local_68.
  super__Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
  ._M_impl.super__Vector_impl_data._M_start = pGVar6;
  genGatherPrograms(dst,&this->m_baseParams,&local_68);
  if (pGVar6 != (pointer)0x0) {
    operator_delete(pGVar6,lVar5 * -0x333333333333332c);
  }
  if (local_48.
      super__Vector_base<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    return;
  }
  return;
}

Assistant:

void TextureGatherCubeCase::initPrograms (vk::SourceCollections& dst) const
{
	const vector<GatherCubeArgs>	iterations	= generateCubeCaseIterations(m_baseParams.gatherType,
																			 m_baseParams.textureFormat,
																			 m_baseParams.offsetSize != OFFSETSIZE_IMPLEMENTATION_MAXIMUM ? getOffsetRange(m_baseParams.offsetSize) : IVec2(0));

	genGatherPrograms(dst, m_baseParams, vector<GatherArgs>(iterations.begin(), iterations.end()));
}